

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint Extra_TruthCanonNP(uint uTruth,int nVars)

{
  uint Truth;
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int Polarity;
  bool bVar5;
  
  if (Extra_TruthCanonNP::pPerms == (char **)0x0) {
    if (nVars < 1) {
LAB_004172e9:
      Extra_TruthCanonNP::nPerms = 1;
    }
    else {
      Extra_TruthCanonNP::nPerms = 1;
      iVar3 = 1;
      do {
        Extra_TruthCanonNP::nPerms = Extra_TruthCanonNP::nPerms * iVar3;
        bVar5 = iVar3 != nVars;
        iVar3 = iVar3 + 1;
      } while (bVar5);
    }
  }
  else {
    if (Extra_TruthCanonNP::nVarsOld == nVars) goto LAB_00417308;
    free(Extra_TruthCanonNP::pPerms);
    Extra_TruthCanonNP::pPerms = (char **)0x0;
    if (nVars < 1) goto LAB_004172e9;
    Extra_TruthCanonNP::nPerms = 1;
    iVar3 = 1;
    do {
      Extra_TruthCanonNP::nPerms = Extra_TruthCanonNP::nPerms * iVar3;
      bVar5 = iVar3 != nVars;
      iVar3 = iVar3 + 1;
    } while (bVar5);
  }
  Extra_TruthCanonNP::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonNP::nVarsOld = nVars;
LAB_00417308:
  uVar4 = 0xffffffff;
  if (nVars != 0x1f) {
    iVar3 = 1 << ((byte)nVars & 0x1f);
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    Polarity = 0;
    do {
      Truth = Extra_TruthPolarize(uTruth,Polarity,nVars);
      if (0 < Extra_TruthCanonNP::nPerms) {
        lVar2 = 0;
        do {
          uVar1 = Extra_TruthPermute(Truth,Extra_TruthCanonNP::pPerms[lVar2],nVars,0);
          if (uVar1 <= uVar4) {
            uVar4 = uVar1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < Extra_TruthCanonNP::nPerms);
      }
      Polarity = Polarity + 1;
    } while (Polarity != iVar3);
  }
  return uVar4;
}

Assistant:

unsigned Extra_TruthCanonNP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}